

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O3

void __thiscall wasm::LocalGraph::computeSSAIndexes(LocalGraph *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
  *this_00;
  _Rb_tree<wasm::LocalSet_*,_wasm::LocalSet_*,_std::_Identity<wasm::LocalSet_*>,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
  *this_01;
  _Base_ptr p_Var3;
  LocalSet **ppLVar4;
  _Hash_node_base *p_Var5;
  long *plVar6;
  undefined1 local_b8 [8];
  unordered_map<unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
  indexSets;
  Iterator ret_1;
  LocalSet *set;
  undefined1 local_50 [8];
  Iterator __begin2;
  
  local_b8 = (undefined1  [8])&indexSets._M_h._M_rehash_policy._M_next_resize;
  indexSets._M_h._M_buckets = (__buckets_ptr)0x1;
  indexSets._M_h._M_bucket_count = 0;
  indexSets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indexSets._M_h._M_element_count._0_4_ = 0x3f800000;
  indexSets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  indexSets._M_h._M_rehash_policy._4_4_ = 0;
  indexSets._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var5 = (this->getSetsMap)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      indexSets._M_h._M_single_bucket = p_Var5 + 2;
      ret_1.parent._0_1_ = p_Var5[10]._M_nxt == (_Hash_node_base *)0x0;
      __begin2.fixedIndex = 0;
      local_50 = (undefined1  [8])indexSets._M_h._M_single_bucket;
      __begin2.parent._0_1_ = ret_1.parent._0_1_;
      if ((bool)ret_1.parent._0_1_) {
        __begin2.usingFixed = false;
        __begin2._9_7_ = 0;
        ret_1.fixedIndex = 0;
        ret_1._8_8_ = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         *)indexSets._M_h._M_single_bucket)->fixed).
                      super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
      }
      else {
        __begin2.fixedIndex = (size_t)p_Var5[8]._M_nxt;
        ret_1.fixedIndex = (size_t)(p_Var5 + 6);
      }
      while( true ) {
        bVar2 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ::
                IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                              *)local_50,(Iterator *)&indexSets._M_h._M_single_bucket);
        if (bVar2) break;
        ppLVar4 = (LocalSet **)(__begin2.fixedIndex + 0x20);
        if ((char)__begin2.parent != '\0') {
          ppLVar4 = (((OrderedFixedStorage<wasm::LocalSet_*,_2UL> *)local_50)->
                    super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems + __begin2._8_8_
          ;
        }
        ret_1.flexibleIterator._M_node = (_Base_ptr)*ppLVar4;
        this_00 = (_Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
                   *)std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_b8,(key_type *)(p_Var5[1]._M_nxt + 2));
        std::
        _Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
        ::_M_insert_unique<wasm::LocalSet*const&>(this_00,(LocalSet **)&ret_1.flexibleIterator);
        if ((char)__begin2.parent == '\x01') {
          __begin2._8_8_ = __begin2._8_8_ + 1;
        }
        else {
          __begin2.fixedIndex = std::_Rb_tree_increment((_Rb_tree_node_base *)__begin2.fixedIndex);
        }
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  p_Var3 = (this->locations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->locations)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      if (**(char **)(p_Var3 + 1) == '\t') {
        this_01 = &std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_b8,(key_type *)(*(char **)(p_Var3 + 1) + 0x10))->_M_t;
        if (((this_01->_M_impl).super__Rb_tree_header._M_node_count == 1) &&
           (*(long *)((this_01->_M_impl).super__Rb_tree_header._M_header._M_left + 1) !=
            *(long *)(p_Var3 + 1))) {
          std::
          _Rb_tree<wasm::LocalSet_*,_wasm::LocalSet_*,_std::_Identity<wasm::LocalSet_*>,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
          ::clear(this_01);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  if (indexSets._M_h._M_bucket_count != 0) {
    plVar6 = (long *)indexSets._M_h._M_bucket_count;
    do {
      if (plVar6[7] == 1) {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&(this->super_LocalGraphBase).SSAIndexes,(uint *)(plVar6 + 1));
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_b8);
  return;
}

Assistant:

void LocalGraph::computeSSAIndexes() {
  std::unordered_map<Index, std::set<LocalSet*>> indexSets;
  for (auto& [get, sets] : getSetsMap) {
    for (auto* set : sets) {
      indexSets[get->index].insert(set);
    }
  }
  for (auto& [curr, _] : locations) {
    if (auto* set = curr->dynCast<LocalSet>()) {
      auto& sets = indexSets[set->index];
      if (sets.size() == 1 && *sets.begin() != curr) {
        // While it has just one set, it is not the right one (us),
        // so mark it invalid.
        sets.clear();
      }
    }
  }
  for (auto& [index, sets] : indexSets) {
    if (sets.size() == 1) {
      SSAIndexes.insert(index);
    }
  }
}